

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mesh.cpp
# Opt level: O0

void __thiscall vera::Mesh::invertNormals(Mesh *this)

{
  bool bVar1;
  reference this_00;
  __normal_iterator<glm::vec<3,_float,_(glm::qualifier)0>_*,_std::vector<glm::vec<3,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<3,_float,_(glm::qualifier)0>_>_>_>
  local_20;
  __normal_iterator<glm::vec<3,_float,_(glm::qualifier)0>_*,_std::vector<glm::vec<3,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<3,_float,_(glm::qualifier)0>_>_>_>
  local_18;
  iterator it;
  Mesh *this_local;
  
  it._M_current = (vec<3,_float,_(glm::qualifier)0> *)this;
  local_18._M_current =
       (vec<3,_float,_(glm::qualifier)0> *)
       std::
       vector<glm::vec<3,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<3,_float,_(glm::qualifier)0>_>_>
       ::begin(&this->m_normals);
  while( true ) {
    local_20._M_current =
         (vec<3,_float,_(glm::qualifier)0> *)
         std::
         vector<glm::vec<3,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<3,_float,_(glm::qualifier)0>_>_>
         ::end(&this->m_normals);
    bVar1 = __gnu_cxx::operator!=(&local_18,&local_20);
    if (!bVar1) break;
    this_00 = __gnu_cxx::
              __normal_iterator<glm::vec<3,_float,_(glm::qualifier)0>_*,_std::vector<glm::vec<3,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<3,_float,_(glm::qualifier)0>_>_>_>
              ::operator*(&local_18);
    glm::vec<3,float,(glm::qualifier)0>::operator*=((vec<3,float,(glm::qualifier)0> *)this_00,-1.0);
    __gnu_cxx::
    __normal_iterator<glm::vec<3,_float,_(glm::qualifier)0>_*,_std::vector<glm::vec<3,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<3,_float,_(glm::qualifier)0>_>_>_>
    ::operator++(&local_18);
  }
  return;
}

Assistant:

void Mesh::invertNormals() {
    for (std::vector<glm::vec3>::iterator it = m_normals.begin(); it != m_normals.end(); ++it)
        *it *= -1.0f;
}